

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Number> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Number>(RecursiveDescentParser *this)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  string *psVar5;
  istream *piVar6;
  element_type *peVar7;
  socklen_t *in_RCX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Number> sVar9;
  string local_3a8 [32];
  ostringstream local_388 [8];
  ostringstream out;
  allocator local_209;
  string local_208 [36];
  int local_1e4;
  istringstream local_1e0 [8];
  istringstream in;
  long local_60;
  int64_t val;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Number> *pResult;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<MyCompiler::Number>();
  if (in_RSI->sym != NUMBER) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"number expected",&local_41);
    except(in_RSI,NUMBER,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  psVar5 = Token::getValue_abi_cxx11_(&in_RSI->currentToken);
  std::__cxx11::istringstream::istringstream(local_1e0,psVar5,8);
  piVar6 = (istream *)std::istream::operator>>(local_1e0,std::noshowbase);
  local_1e4 = (int)std::setbase(10);
  piVar6 = std::operator>>(piVar6,(_Setbase)local_1e4);
  std::istream::operator>>(piVar6,&local_60);
  bVar3 = std::ios::fail();
  lVar1 = local_60;
  if ((bVar3 & 1) == 0) {
    iVar4 = std::numeric_limits<int>::max();
    lVar2 = local_60;
    in_RCX = (socklen_t *)(long)iVar4;
    if (lVar1 <= (long)in_RCX) {
      iVar4 = std::numeric_limits<int>::min();
      in_RCX = (socklen_t *)(long)iVar4;
      if ((long)in_RCX <= lVar2) goto LAB_001066a6;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"this number is too large",&local_209);
  except(in_RSI,NUMBER,(string *)local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
LAB_001066a6:
  peVar7 = std::__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Number::setNum(peVar7,local_60);
  std::__cxx11::ostringstream::ostringstream(local_388);
  std::ostream::operator<<((ostream *)local_388,local_60);
  std::__cxx11::ostringstream::str();
  peVar7 = std::__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&(peVar7->super_AbstractAstNode).value,local_3a8);
  std::__cxx11::string::~string(local_3a8);
  accept(in_RSI,in_RSI->sym,__addr,in_RCX);
  local_19 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::__cxx11::istringstream::~istringstream(local_1e0);
  _Var8._M_pi = extraout_RDX;
  if ((local_19 & 1) == 0) {
    std::shared_ptr<MyCompiler::Number>::~shared_ptr((shared_ptr<MyCompiler::Number> *)this);
    _Var8._M_pi = extraout_RDX_00;
  }
  sVar9.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Number>)
         sVar9.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Number> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Number>();

    if (sym != SymbolType::NUMBER)
        except(SymbolType::NUMBER, "number expected");
    int64_t val;
    std::istringstream in(currentToken.getValue());
    in >> std::noshowbase >> std::setbase(10) >> val;
    if (in.fail() || val > std::numeric_limits<int32_t>::max() || val < std::numeric_limits<int32_t>::min())
        except(SymbolType::NUMBER, "this number is too large");
    pResult->setNum(val);
    std::ostringstream out;
    out << val;
    pResult->value = out.str();
    accept(sym);

    return pResult;
}